

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_renderer_base.h
# Opt level: O0

void __thiscall
agg::
renderer_base<agg::pixfmt_alpha_blend_rgba<agg::blender_rgba_pre<agg::rgba8T<agg::linear>,_agg::order_bgra>,_agg::row_accessor<unsigned_char>_>_>
::blend_hline(renderer_base<agg::pixfmt_alpha_blend_rgba<agg::blender_rgba_pre<agg::rgba8T<agg::linear>,_agg::order_bgra>,_agg::row_accessor<unsigned_char>_>_>
              *this,int x1,int y,int x2,color_type *c,cover_type cover)

{
  int iVar1;
  int t;
  cover_type cover_local;
  color_type *c_local;
  int x2_local;
  int y_local;
  int x1_local;
  renderer_base<agg::pixfmt_alpha_blend_rgba<agg::blender_rgba_pre<agg::rgba8T<agg::linear>,_agg::order_bgra>,_agg::row_accessor<unsigned_char>_>_>
  *this_local;
  
  c_local._4_4_ = x2;
  x2_local = x1;
  if (x2 < x1) {
    c_local._4_4_ = x1;
    x2_local = x2;
  }
  iVar1 = ymax(this);
  if ((((y <= iVar1) && (iVar1 = ymin(this), iVar1 <= y)) && (iVar1 = xmax(this), x2_local <= iVar1)
      ) && (iVar1 = xmin(this), iVar1 <= c_local._4_4_)) {
    iVar1 = xmin(this);
    if (x2_local < iVar1) {
      x2_local = xmin(this);
    }
    iVar1 = xmax(this);
    if (iVar1 < c_local._4_4_) {
      c_local._4_4_ = xmax(this);
    }
    pixfmt_alpha_blend_rgba<agg::blender_rgba_pre<agg::rgba8T<agg::linear>,_agg::order_bgra>,_agg::row_accessor<unsigned_char>_>
    ::blend_hline(this->m_ren,x2_local,y,(c_local._4_4_ - x2_local) + 1,c,cover);
  }
  return;
}

Assistant:

void blend_hline(int x1, int y, int x2, 
                         const color_type& c, cover_type cover)
        {
            if(x1 > x2) { int t = x2; x2 = x1; x1 = t; }
            if(y  > ymax()) return;
            if(y  < ymin()) return;
            if(x1 > xmax()) return;
            if(x2 < xmin()) return;

            if(x1 < xmin()) x1 = xmin();
            if(x2 > xmax()) x2 = xmax();

            m_ren->blend_hline(x1, y, x2 - x1 + 1, c, cover);
        }